

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O0

BufferOrError * __thiscall
slang::SourceManager::readHeader
          (SourceManager *this,string_view path,SourceLocation includedFrom,SourceLibrary *library,
          bool isSystemPath,
          span<const_std::filesystem::__cxx11::path,_18446744073709551615UL> additionalIncludePaths)

{
  bool bVar1;
  FileInfo *this_00;
  basic_string_view<char,_std::char_traits<char>_> *in_RSI;
  BufferOrError *in_RDI;
  undefined8 in_R8;
  long in_R9;
  error_code eVar2;
  unexpected_type<std::error_code> uVar3;
  byte in_stack_00000008;
  uint64_t in_stack_00000050;
  SourceLibrary *in_stack_00000058;
  path *in_stack_00000060;
  SourceManager *in_stack_00000068;
  SourceLocation in_stack_00000070;
  path *d_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  *__range1_1;
  shared_lock<std::shared_mutex> includeDirLock;
  path *dir_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  *__range2_1;
  path *dir;
  iterator __end1;
  iterator __begin1;
  span<const_std::filesystem::__cxx11::path,_18446744073709551615UL> *__range1;
  FileInfo *info;
  shared_lock<std::shared_mutex> lock;
  path *currFileDir;
  path *d;
  iterator __end2;
  iterator __begin2;
  vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_> *__range2;
  shared_lock<std::shared_mutex> includeDirLock_1;
  path p;
  BufferOrError *result;
  span<const_std::filesystem::__cxx11::path,_18446744073709551615UL> *in_stack_fffffffffffffd18;
  path *in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd2c;
  SourceManager *in_stack_fffffffffffffd30;
  path *in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd4c;
  undefined1 *puVar4;
  undefined4 in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd74;
  __normal_iterator<std::filesystem::__cxx11::path_*,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_>
  local_228;
  basic_string_view<char,_std::char_traits<char>_> *local_220;
  undefined8 local_208;
  byte local_1d1;
  reference local_1d0;
  path *local_1c8;
  __normal_iterator<const_std::filesystem::__cxx11::path_*,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_>
  local_1c0;
  long local_1b8;
  undefined8 local_1b0;
  byte local_179;
  reference local_178;
  path *local_170;
  __normal_iterator<const_std::filesystem::__cxx11::path_*,_std::span<const_std::filesystem::__cxx11::path,_18446744073709551615UL>_>
  local_168;
  undefined1 *local_160;
  undefined8 local_158;
  byte local_125;
  uint32_t local_124;
  FileInfo *local_120;
  path *local_108;
  int local_100;
  error_category *local_f8;
  int local_f0;
  error_category *local_e8;
  undefined8 local_e0;
  byte local_a9;
  reference local_a8;
  path *local_a0;
  __normal_iterator<std::filesystem::__cxx11::path_*,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_>
  local_98;
  char **local_90;
  uint local_78;
  undefined8 local_68;
  byte local_31;
  long local_30;
  undefined8 local_20;
  
  puVar4 = &stack0x00000010;
  local_31 = in_stack_00000008 & 1;
  local_30 = in_R9;
  local_20 = in_R8;
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            ((path *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),in_RSI,
             (format)((ulong)puVar4 >> 0x38));
  bVar1 = std::filesystem::__cxx11::path::is_absolute((path *)0x2e3247);
  if (bVar1) {
    local_68 = local_20;
    openCached(in_stack_00000068,in_stack_00000060,in_stack_00000070,in_stack_00000058,
               in_stack_00000050);
    local_78 = 1;
  }
  else if ((local_31 & 1) == 0) {
    local_108 = (path *)0x0;
    std::shared_lock<std::shared_mutex>::shared_lock
              ((shared_lock<std::shared_mutex> *)in_stack_fffffffffffffd20,
               (mutex_type *)in_stack_fffffffffffffd18);
    local_124 = (uint32_t)
                SourceLocation::buffer
                          ((SourceLocation *)
                           CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
    this_00 = getFileInfo<std::shared_lock<std::shared_mutex>_>
                        (in_stack_fffffffffffffd30,(BufferID)local_124,
                         (shared_lock<std::shared_mutex> *)
                         CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
    if ((this_00 != (FileInfo *)0x0) && (this_00->data != (FileData *)0x0)) {
      local_108 = this_00->data->directory;
    }
    local_120 = this_00;
    std::shared_lock<std::shared_mutex>::~shared_lock
              ((shared_lock<std::shared_mutex> *)in_stack_fffffffffffffd20);
    if (local_108 != (path *)0x0) {
      local_125 = 0;
      std::filesystem::__cxx11::operator/
                ((path *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                 in_stack_fffffffffffffd40);
      local_158 = local_20;
      openCached(in_stack_00000068,in_stack_00000060,in_stack_00000070,in_stack_00000058,
                 in_stack_00000050);
      std::filesystem::__cxx11::path::~path(in_stack_fffffffffffffd20);
      bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool
                        ((expected<slang::SourceBuffer,_std::error_code> *)0x2e364f);
      if (bVar1) {
        local_125 = 1;
      }
      local_78 = (uint)bVar1;
      if ((local_125 & 1) == 0) {
        nonstd::expected_lite::expected<slang::SourceBuffer,_std::error_code>::~expected
                  ((expected<slang::SourceBuffer,_std::error_code> *)in_stack_fffffffffffffd20);
      }
      if (local_78 != 0) goto LAB_002e3bc8;
    }
    local_160 = puVar4;
    local_168._M_current =
         (path *)std::span<const_std::filesystem::__cxx11::path,_18446744073709551615UL>::begin
                           (in_stack_fffffffffffffd18);
    local_170 = (path *)std::span<const_std::filesystem::__cxx11::path,_18446744073709551615UL>::end
                                  ((span<const_std::filesystem::__cxx11::path,_18446744073709551615UL>
                                    *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28))
    ;
    while (bVar1 = __gnu_cxx::
                   operator==<const_std::filesystem::__cxx11::path_*,_std::span<const_std::filesystem::__cxx11::path,_18446744073709551615UL>_>
                             ((__normal_iterator<const_std::filesystem::__cxx11::path_*,_std::span<const_std::filesystem::__cxx11::path,_18446744073709551615UL>_>
                               *)in_stack_fffffffffffffd20,
                              (__normal_iterator<const_std::filesystem::__cxx11::path_*,_std::span<const_std::filesystem::__cxx11::path,_18446744073709551615UL>_>
                               *)in_stack_fffffffffffffd18), ((bVar1 ^ 0xffU) & 1) != 0) {
      local_178 = __gnu_cxx::
                  __normal_iterator<const_std::filesystem::__cxx11::path_*,_std::span<const_std::filesystem::__cxx11::path,_18446744073709551615UL>_>
                  ::operator*(&local_168);
      local_179 = 0;
      std::filesystem::__cxx11::operator/
                ((path *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                 in_stack_fffffffffffffd40);
      local_1b0 = local_20;
      openCached(in_stack_00000068,in_stack_00000060,in_stack_00000070,in_stack_00000058,
                 in_stack_00000050);
      std::filesystem::__cxx11::path::~path(in_stack_fffffffffffffd20);
      bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool
                        ((expected<slang::SourceBuffer,_std::error_code> *)0x2e37ac);
      if (bVar1) {
        local_179 = 1;
      }
      local_78 = (uint)bVar1;
      if ((local_179 & 1) == 0) {
        nonstd::expected_lite::expected<slang::SourceBuffer,_std::error_code>::~expected
                  ((expected<slang::SourceBuffer,_std::error_code> *)in_stack_fffffffffffffd20);
      }
      if (local_78 != 0) goto LAB_002e3bc8;
      __gnu_cxx::
      __normal_iterator<const_std::filesystem::__cxx11::path_*,_std::span<const_std::filesystem::__cxx11::path,_18446744073709551615UL>_>
      ::operator++(&local_168);
    }
    if (local_30 != 0) {
      local_1b8 = local_30 + 0x20;
      local_1c0._M_current =
           (path *)std::
                   vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                   ::begin((vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                            *)in_stack_fffffffffffffd18);
      local_1c8 = (path *)std::
                          vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                          ::end((vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                                 *)in_stack_fffffffffffffd18);
      while (bVar1 = __gnu_cxx::
                     operator==<const_std::filesystem::__cxx11::path_*,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_>
                               ((__normal_iterator<const_std::filesystem::__cxx11::path_*,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_>
                                 *)in_stack_fffffffffffffd20,
                                (__normal_iterator<const_std::filesystem::__cxx11::path_*,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_>
                                 *)in_stack_fffffffffffffd18), ((bVar1 ^ 0xffU) & 1) != 0) {
        local_1d0 = __gnu_cxx::
                    __normal_iterator<const_std::filesystem::__cxx11::path_*,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_>
                    ::operator*(&local_1c0);
        local_1d1 = 0;
        std::filesystem::__cxx11::operator/
                  ((path *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                   in_stack_fffffffffffffd40);
        local_208 = local_20;
        openCached(in_stack_00000068,in_stack_00000060,in_stack_00000070,in_stack_00000058,
                   in_stack_00000050);
        std::filesystem::__cxx11::path::~path(in_stack_fffffffffffffd20);
        bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool
                          ((expected<slang::SourceBuffer,_std::error_code> *)0x2e3931);
        if (bVar1) {
          local_1d1 = 1;
        }
        local_78 = (uint)bVar1;
        if ((local_1d1 & 1) == 0) {
          nonstd::expected_lite::expected<slang::SourceBuffer,_std::error_code>::~expected
                    ((expected<slang::SourceBuffer,_std::error_code> *)in_stack_fffffffffffffd20);
        }
        if (local_78 != 0) goto LAB_002e3bc8;
        __gnu_cxx::
        __normal_iterator<const_std::filesystem::__cxx11::path_*,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_>
        ::operator++(&local_1c0);
      }
    }
    std::shared_lock<std::shared_mutex>::shared_lock
              ((shared_lock<std::shared_mutex> *)in_stack_fffffffffffffd20,
               (mutex_type *)in_stack_fffffffffffffd18);
    local_220 = in_RSI + 0xd;
    local_228._M_current =
         (path *)std::
                 vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                 ::begin((vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                          *)in_stack_fffffffffffffd18);
    std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
    end((vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_> *)
        in_stack_fffffffffffffd18);
    while (bVar1 = __gnu_cxx::
                   operator==<std::filesystem::__cxx11::path_*,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_>
                             ((__normal_iterator<std::filesystem::__cxx11::path_*,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_>
                               *)in_stack_fffffffffffffd20,
                              (__normal_iterator<std::filesystem::__cxx11::path_*,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_>
                               *)in_stack_fffffffffffffd18), ((bVar1 ^ 0xffU) & 1) != 0) {
      __gnu_cxx::
      __normal_iterator<std::filesystem::__cxx11::path_*,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_>
      ::operator*(&local_228);
      std::filesystem::__cxx11::operator/
                ((path *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                 in_stack_fffffffffffffd40);
      openCached(in_stack_00000068,in_stack_00000060,in_stack_00000070,in_stack_00000058,
                 in_stack_00000050);
      std::filesystem::__cxx11::path::~path(in_stack_fffffffffffffd20);
      bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool
                        ((expected<slang::SourceBuffer,_std::error_code> *)0x2e3aba);
      local_78 = (uint)bVar1;
      if (!bVar1) {
        nonstd::expected_lite::expected<slang::SourceBuffer,_std::error_code>::~expected
                  ((expected<slang::SourceBuffer,_std::error_code> *)in_stack_fffffffffffffd20);
      }
      if (local_78 != 0) goto LAB_002e3baa;
      __gnu_cxx::
      __normal_iterator<std::filesystem::__cxx11::path_*,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_>
      ::operator++(&local_228);
    }
    std::make_error_code(0);
    uVar3 = nonstd::expected_lite::make_unexpected<std::error_code>((error_code *)0x2e3b71);
    in_stack_fffffffffffffd20 = (path *)uVar3.m_error._M_cat;
    nonstd::expected_lite::expected<slang::SourceBuffer,_std::error_code>::
    expected<std::error_code,_0>
              ((expected<slang::SourceBuffer,_std::error_code> *)this_00,
               (unexpected_type<std::error_code> *)
               CONCAT44(uVar3.m_error._M_value,in_stack_fffffffffffffd28));
    local_78 = 1;
LAB_002e3baa:
    std::shared_lock<std::shared_mutex>::~shared_lock
              ((shared_lock<std::shared_mutex> *)in_stack_fffffffffffffd20);
  }
  else {
    std::shared_lock<std::shared_mutex>::shared_lock
              ((shared_lock<std::shared_mutex> *)in_stack_fffffffffffffd20,
               (mutex_type *)in_stack_fffffffffffffd18);
    local_90 = &in_RSI[0xb]._M_str;
    local_98._M_current =
         (path *)std::
                 vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                 ::begin((vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                          *)in_stack_fffffffffffffd18);
    local_a0 = (path *)std::
                       vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                       ::end((vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                              *)in_stack_fffffffffffffd18);
    while (bVar1 = __gnu_cxx::
                   operator==<std::filesystem::__cxx11::path_*,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_>
                             ((__normal_iterator<std::filesystem::__cxx11::path_*,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_>
                               *)in_stack_fffffffffffffd20,
                              (__normal_iterator<std::filesystem::__cxx11::path_*,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_>
                               *)in_stack_fffffffffffffd18), ((bVar1 ^ 0xffU) & 1) != 0) {
      local_a8 = __gnu_cxx::
                 __normal_iterator<std::filesystem::__cxx11::path_*,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_>
                 ::operator*(&local_98);
      local_a9 = 0;
      std::filesystem::__cxx11::operator/
                ((path *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                 in_stack_fffffffffffffd40);
      local_e0 = local_20;
      openCached(in_stack_00000068,in_stack_00000060,in_stack_00000070,in_stack_00000058,
                 in_stack_00000050);
      std::filesystem::__cxx11::path::~path(in_stack_fffffffffffffd20);
      bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool
                        ((expected<slang::SourceBuffer,_std::error_code> *)0x2e33cc);
      if (bVar1) {
        local_a9 = 1;
      }
      local_78 = (uint)bVar1;
      if ((local_a9 & 1) == 0) {
        nonstd::expected_lite::expected<slang::SourceBuffer,_std::error_code>::~expected
                  ((expected<slang::SourceBuffer,_std::error_code> *)in_stack_fffffffffffffd20);
      }
      if (local_78 != 0) goto LAB_002e34ce;
      __gnu_cxx::
      __normal_iterator<std::filesystem::__cxx11::path_*,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_>
      ::operator++(&local_98);
    }
    eVar2 = std::make_error_code(0);
    local_f8 = eVar2._M_cat;
    local_100 = eVar2._M_value;
    uVar3 = nonstd::expected_lite::make_unexpected<std::error_code>((error_code *)0x2e348c);
    local_e8 = uVar3.m_error._M_cat;
    local_f0 = uVar3.m_error._M_value;
    nonstd::expected_lite::expected<slang::SourceBuffer,_std::error_code>::
    expected<std::error_code,_0>
              ((expected<slang::SourceBuffer,_std::error_code> *)in_stack_fffffffffffffd30,
               (unexpected_type<std::error_code> *)
               CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
    local_78 = 1;
LAB_002e34ce:
    std::shared_lock<std::shared_mutex>::~shared_lock
              ((shared_lock<std::shared_mutex> *)in_stack_fffffffffffffd20);
  }
LAB_002e3bc8:
  std::filesystem::__cxx11::path::~path(in_stack_fffffffffffffd20);
  return in_RDI;
}

Assistant:

SourceManager::BufferOrError SourceManager::readHeader(
    std::string_view path, SourceLocation includedFrom, const SourceLibrary* library,
    bool isSystemPath, std::span<std::filesystem::path const> additionalIncludePaths) {

    // if the header is specified as an absolute path, just do a straight lookup
    SLANG_ASSERT(!path.empty());
    fs::path p = path;
    if (p.is_absolute())
        return openCached(p, includedFrom, library);

    // system path lookups only look in system directories
    if (isSystemPath) {
        // Separate lock for the include dirs here so that we can iterate
        // over them without having to make a copy. It's unlikely that the
        // list is being modified while we're reading headers anyway.
        std::shared_lock<std::shared_mutex> includeDirLock(includeDirMutex);
        for (auto& d : systemDirectories) {
            auto result = openCached(d / p, includedFrom, library);
            if (result)
                return result;
        }
        return nonstd::make_unexpected(make_error_code(std::errc::no_such_file_or_directory));
    }

    // search relative to the current file
    const fs::path* currFileDir = nullptr;
    {
        std::shared_lock<std::shared_mutex> lock(mutex);
        auto info = getFileInfo(includedFrom.buffer(), lock);
        if (info && info->data)
            currFileDir = info->data->directory;
    }

    if (currFileDir) {
        auto result = openCached(*currFileDir / p, includedFrom, library);
        if (result)
            return result;
    }

    for (auto& dir : additionalIncludePaths) {
        auto result = openCached(dir / p, includedFrom, library);
        if (result)
            return result;
    }

    // Use library-specific include dirs if they exist.
    if (library) {
        for (auto& dir : library->includeDirs) {
            auto result = openCached(dir / p, includedFrom, library);
            if (result)
                return result;
        }
    }

    // See comment above about this separate mutex / lock.
    std::shared_lock<std::shared_mutex> includeDirLock(includeDirMutex);
    for (auto& d : userDirectories) {
        auto result = openCached(d / p, includedFrom, library);
        if (result)
            return result;
    }

    return nonstd::make_unexpected(make_error_code(std::errc::no_such_file_or_directory));
}